

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

void __thiscall summarycalc::doit(summarycalc *this)

{
  if (this->inputtype_ == FM_STREAM) {
    dofmsummary(this);
  }
  else if (this->inputtype_ == UNKNOWN) {
    doit();
    return;
  }
  if (this->inputtype_ == GUL_COVERAGE_STREAM) {
    dogulcoveragesummary(this);
  }
  if (this->inputtype_ == GUL_ITEM_STREAM) {
    dogulitemsummary(this);
  }
  if (this->inputtype_ != GUL_ITEMX_STREAM) {
    return;
  }
  dogulitemxsummary(this);
  return;
}

Assistant:

void summarycalc::doit()
{
	if (inputtype_ == UNKNOWN) {
		fprintf(stderr,"FATAL: summarycalc: stream type unknown\n");
		return;
	}
	
	if (inputtype_ == FM_STREAM) {
		dofmsummary();
	}
	
	if (inputtype_ == GUL_COVERAGE_STREAM) {
		dogulcoveragesummary();
	}
	if (inputtype_ == GUL_ITEM_STREAM) {
		dogulitemsummary();
	}
	if (inputtype_ == GUL_ITEMX_STREAM) {
		dogulitemxsummary();
	}
}